

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O1

int __thiscall
SPP::solveSPV(SPP *this,Satellite **GPSPosAndVel,Satellite **BDSPosAndVel,Obs **GPSObs,Obs **BDSObs,
             Ephemeris **GPSEph,Ephemeris **BDSEph,ELLIPSOID type)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Satellite *pSVar5;
  double dVar6;
  XYZ a;
  XYZ a_00;
  double *pdVar7;
  double *pdVar8;
  int iVar9;
  int i;
  uint row;
  void *__src;
  int iVar10;
  Matrix<double,__1,__1> *this_00;
  long lVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  MatrixXd B;
  MatrixXd w;
  MatrixXd P;
  MatrixXd v;
  XYZ RefV;
  int flag;
  Vector3d dx;
  MatrixXd tmp5;
  MatrixXd tmp4;
  MatrixXd tmp3;
  MatrixXd tmp2;
  MatrixXd tmp1;
  MatrixXd B_T;
  MatrixXd tmp10;
  MatrixXd tmp9;
  MatrixXd tmp8;
  MatrixXd tmp7;
  MatrixXd tmp6;
  Matrix<double,__1,__1> local_1e8;
  double local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  SPP *local_1b8;
  double local_1b0;
  int local_1a4;
  Matrix<double,__1,__1> local_1a0;
  Matrix<double,__1,__1> local_190;
  double local_180;
  double local_178;
  XYZ *local_170;
  double local_168;
  Matrix<double,__1,__1> local_160;
  XYZ local_150;
  double local_138;
  undefined8 uStack_130;
  int local_124;
  double local_120;
  double dStack_118;
  double local_110;
  double local_108;
  double dStack_100;
  double local_f8;
  Matrix<double,_3,_1> local_f0;
  Matrix<double,__1,__1> local_e0;
  Matrix<double,__1,__1> local_d0;
  Matrix<double,__1,__1> local_c0;
  Matrix<double,__1,__1> local_b0;
  Matrix<double,__1,__1> local_a0;
  Matrix<double,__1,__1> local_90;
  Matrix<double,__1,__1> local_80;
  Matrix<double,__1,__1> local_70;
  Matrix<double,__1,__1> local_60;
  Matrix<double,__1,__1> local_50;
  Matrix<double,__1,__1> local_40;
  
  pdVar8 = &(*GPSPosAndVel)->n;
  iVar9 = 0;
  lVar11 = 0x40;
  do {
    if (((*pdVar8 != -1.0) || (NAN(*pdVar8))) &&
       ((fVar1 = *(float *)((long)(*GPSObs)->psr + lVar11 + -0x10), fVar1 != -1.0 || (NAN(fVar1)))))
    {
      iVar9 = iVar9 + 1;
    }
    pdVar8 = pdVar8 + 0x17;
    lVar11 = lVar11 + 0x70;
  } while (lVar11 != 0xe40);
  pdVar8 = &(*BDSPosAndVel)->n;
  iVar10 = 0;
  lVar11 = 0x40;
  do {
    if (((*pdVar8 != -1.0) || (NAN(*pdVar8))) &&
       ((fVar1 = *(float *)((long)(*BDSObs)->psr + lVar11 + -0x10), fVar1 != -1.0 || (NAN(fVar1)))))
    {
      iVar10 = iVar10 + 1;
    }
    pdVar8 = pdVar8 + 0x17;
    lVar11 = lVar11 + 0x70;
  } while (lVar11 != 0x1c40);
  local_168 = (this->result).UserPositionXYZ.Z;
  iVar13 = 1;
  if ((local_168 != -1.0) || (NAN(local_168))) {
    local_170 = &(this->result).UserPositionXYZ;
    local_178 = (this->result).UserPositionXYZ.X;
    local_180 = (this->result).UserPositionXYZ.Y;
    local_1a4 = iVar10 + iVar9;
    Matrix<double,_-1,_-1>::Matrix(&local_1e8,local_1a4,4);
    Matrix<double,_-1,_-1>::Matrix(&local_190,local_1e8.rows,local_1e8.rows);
    Matrix<double,_-1,_-1>::Matrix(&local_1a0,local_1e8.rows,1);
    XYZ::XYZ(&local_150,0.0,0.0,0.0);
    Matrix<double,_-1,_-1>::Zero(&local_1e8);
    Matrix<double,_-1,_-1>::Zero(&local_190);
    local_1b8 = this;
    if (iVar9 == 0) {
      iVar13 = 0;
    }
    else {
      pdVar8 = (double *)&(this->result).field_0x680;
      lVar14 = 0;
      lVar11 = 0x40;
      uVar12 = 0;
      iVar13 = 0;
      do {
        pSVar5 = *GPSPosAndVel;
        dVar2 = *(double *)((long)&pSVar5->n + lVar14);
        if (((dVar2 != -1.0) || (NAN(dVar2))) &&
           ((fVar1 = *(float *)((long)(*GPSObs)->psr + lVar11 + -0x10), fVar1 != -1.0 ||
            (NAN(fVar1))))) {
          dVar2 = *(double *)((long)&(pSVar5->SatVelocity).X + lVar14);
          dVar3 = *(double *)((long)&(pSVar5->SatVelocity).Y + lVar14);
          local_1c8._0_8_ = *(undefined8 *)((long)&(pSVar5->SatVelocity).Z + lVar14);
          local_138 = *(double *)*(undefined1 (*) [16])(pdVar8 + -2);
          local_1b0 = pdVar8[-1];
          local_1d8 = *pdVar8;
          a.Z = local_1d8;
          a._0_16_ = *(undefined1 (*) [16])(pdVar8 + -2);
          local_108 = local_138;
          dStack_100 = local_1b0;
          local_f8 = local_1d8;
          dVar6 = dist(a,*local_170);
          local_138 = (local_178 - local_138) / dVar6;
          uStack_130 = 0;
          local_1b0 = (local_180 - local_1b0) / dVar6;
          local_1d8 = (local_168 - local_1d8) / dVar6;
          local_1c8._8_4_ = DAT_001111f0._8_4_;
          local_1c8._0_8_ =
               ((double)((ulong)local_138 ^ (ulong)DAT_001111f0) * dVar2 - dVar3 * local_1b0) -
               (double)local_1c8._0_8_ * local_1d8;
          local_1c8._12_4_ = DAT_001111f0._12_4_;
          dVar2 = *(double *)((long)&(*GPSPosAndVel)->clkdot + lVar14);
          pdVar7 = Matrix<double,_-1,_-1>::operator()(&local_1e8,iVar13,0);
          *pdVar7 = local_138;
          pdVar7 = Matrix<double,_-1,_-1>::operator()(&local_1e8,iVar13,1);
          *pdVar7 = local_1b0;
          pdVar7 = Matrix<double,_-1,_-1>::operator()(&local_1e8,iVar13,2);
          *pdVar7 = local_1d8;
          pdVar7 = Matrix<double,_-1,_-1>::operator()(&local_1e8,iVar13,3);
          *pdVar7 = 1.0;
          local_1c8._0_8_ =
               (((double)*(float *)((long)(*GPSObs)->psr + lVar11 + -0x10) * 299792458.0) /
                -1575420000.0 - (double)local_1c8._0_8_) + dVar2 * 299792458.0;
          pdVar7 = Matrix<double,_-1,_-1>::operator()(&local_1a0,iVar13,0);
          *pdVar7 = (double)local_1c8._0_8_;
          pdVar7 = Matrix<double,_-1,_-1>::operator()(&local_190,iVar13,iVar13);
          *pdVar7 = 1.0;
          iVar13 = iVar13 + 1;
        }
        if (0x1e < uVar12) break;
        uVar12 = uVar12 + 1;
        pdVar8 = pdVar8 + 3;
        lVar14 = lVar14 + 0xb8;
        lVar11 = lVar11 + 0x70;
      } while (iVar9 != 0);
    }
    if (iVar10 != 0) {
      pdVar8 = (double *)&(local_1b8->result).field_0x80;
      lVar14 = 0x40;
      lVar11 = 0;
      uVar12 = 0;
      do {
        pSVar5 = *BDSPosAndVel;
        dVar2 = *(double *)((long)&pSVar5->n + lVar11);
        if (((dVar2 != -1.0) || (NAN(dVar2))) &&
           ((fVar1 = *(float *)((long)(*BDSObs)->psr + lVar14 + -0x10), fVar1 != -1.0 ||
            (NAN(fVar1))))) {
          dVar2 = *(double *)((long)&(pSVar5->SatVelocity).X + lVar11);
          local_1c8._0_8_ = *(undefined8 *)((long)&(pSVar5->SatVelocity).Y + lVar11);
          dVar3 = *(double *)((long)&(pSVar5->SatVelocity).Z + lVar11);
          local_1d8 = *(double *)*(undefined1 (*) [16])(pdVar8 + -2);
          dVar6 = pdVar8[-1];
          dVar4 = *pdVar8;
          a_00.Z = dVar4;
          a_00._0_16_ = *(undefined1 (*) [16])(pdVar8 + -2);
          local_120 = local_1d8;
          dStack_118 = dVar6;
          local_110 = dVar4;
          dVar16 = dist(a_00,*local_170);
          local_1d8 = (local_178 - local_1d8) / dVar16;
          uStack_1d0 = 0;
          dVar15 = (local_180 - dVar6) / dVar16;
          dVar16 = (local_168 - dVar4) / dVar16;
          dVar4 = (double)((ulong)local_1d8 ^ (ulong)DAT_001111f0);
          dVar17 = (double)local_1c8._0_8_ * dVar15;
          dVar6 = *(double *)((long)&(*BDSPosAndVel)->clkdot + lVar11);
          pdVar7 = Matrix<double,_-1,_-1>::operator()(&local_1e8,iVar13,0);
          *pdVar7 = local_1d8;
          pdVar7 = Matrix<double,_-1,_-1>::operator()(&local_1e8,iVar13,1);
          *pdVar7 = dVar15;
          pdVar7 = Matrix<double,_-1,_-1>::operator()(&local_1e8,iVar13,2);
          *pdVar7 = dVar16;
          pdVar7 = Matrix<double,_-1,_-1>::operator()(&local_1e8,iVar13,3);
          *pdVar7 = 1.0;
          fVar1 = *(float *)((long)(*BDSObs)->psr + lVar14 + -0x10);
          pdVar7 = Matrix<double,_-1,_-1>::operator()(&local_1a0,iVar13,0);
          *pdVar7 = (((double)fVar1 * 299792458.0) / -1561098000.0 -
                    ((dVar4 * dVar2 - dVar17) - dVar3 * dVar16)) + dVar6 * 299792458.0;
          pdVar7 = Matrix<double,_-1,_-1>::operator()(&local_190,iVar13,iVar13);
          *pdVar7 = 1.0;
          iVar13 = iVar13 + 1;
        }
        if (0x3e < uVar12) break;
        uVar12 = uVar12 + 1;
        pdVar8 = pdVar8 + 3;
        lVar11 = lVar11 + 0xb8;
        lVar14 = lVar14 + 0x70;
      } while (iVar10 != 0);
    }
    local_124 = 0;
    local_90 = Matrix<double,_-1,_-1>::transpose(&local_1e8);
    local_a0 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_90,&local_190);
    local_b0 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_a0,&local_1e8);
    local_c0 = Matrix<double,_-1,_-1>::inverse(&local_b0,&local_124);
    local_d0 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_c0,&local_90);
    local_e0 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_d0,&local_190);
    local_160 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_e0,&local_1a0);
    if (local_124 == 0) {
      pdVar8 = Matrix<double,_-1,_-1>::operator()(&local_160,0,0);
      local_150.X = *pdVar8 + local_150.X;
      pdVar8 = Matrix<double,_-1,_-1>::operator()(&local_160,1,0);
      local_150.Y = *pdVar8 + local_150.Y;
      pdVar8 = Matrix<double,_-1,_-1>::operator()(&local_160,2,0);
      local_150.Z = *pdVar8 + local_150.Z;
      Matrix<double,_-1,_-1>::operator()(&local_160,3,0);
      local_40 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_1e8,&local_160);
      local_50 = Matrix<double,_-1,_-1>::operator-(&local_40,&local_1a0);
      local_60 = Matrix<double,_-1,_-1>::transpose(&local_50);
      local_70 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_60,&local_190);
      local_80 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_70,&local_50);
      pdVar8 = Matrix<double,_-1,_-1>::operator()(&local_80,0,0);
      dVar2 = *pdVar8 / (double)(local_1a4 + -4);
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      (local_1b8->result).UserVelocitySigma = dVar2;
      if (local_40.data != (double *)0x0) {
        operator_delete__(local_40.data);
      }
      if (local_50.data != (double *)0x0) {
        operator_delete__(local_50.data);
      }
      if (local_60.data != (double *)0x0) {
        operator_delete__(local_60.data);
      }
      if (local_70.data != (double *)0x0) {
        operator_delete__(local_70.data);
      }
      if (local_80.data != (double *)0x0) {
        operator_delete__(local_80.data);
      }
      local_f0.data = (double *)0x0;
      local_f0.rows = 3;
      local_f0.cols = 1;
      local_f0.data = (double *)operator_new__(0x18);
      row = 0;
      do {
        pdVar8 = Matrix<double,_-1,_-1>::operator()(&local_160,row,0);
        dVar2 = *pdVar8;
        __src = (void *)(ulong)row;
        pdVar8 = Matrix<double,_3,_1>::operator()(&local_f0,row,0);
        *pdVar8 = dVar2;
        row = row + 1;
      } while ((int)row < local_f0.rows);
      Matrix<double,_3,_1>::deleteMatrix(&local_f0);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_90);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_a0);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_b0);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_c0);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_d0);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_e0);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_160);
      (local_1b8->result).UserVelocity.Z = local_150.Z;
      (local_1b8->result).UserVelocity.X = local_150.X;
      (local_1b8->result).UserVelocity.Y = local_150.Y;
      Matrix<double,_-1,_-1>::deleteMatrix(&local_1e8);
      Matrix<double,_-1,_-1>::deleteMatrix(&local_190);
      this_00 = &local_1a0;
      Matrix<double,_-1,_-1>::deleteMatrix(this_00);
      memcpy(this_00,__src,0x12b8);
      return (int)this_00;
    }
    if (local_90.data != (double *)0x0) {
      operator_delete__(local_90.data);
    }
    if (local_a0.data != (double *)0x0) {
      operator_delete__(local_a0.data);
    }
    if (local_b0.data != (double *)0x0) {
      operator_delete__(local_b0.data);
    }
    if (local_c0.data != (double *)0x0) {
      operator_delete__(local_c0.data);
    }
    if (local_d0.data != (double *)0x0) {
      operator_delete__(local_d0.data);
    }
    if (local_e0.data != (double *)0x0) {
      operator_delete__(local_e0.data);
    }
    if (local_190.data != (double *)0x0) {
      operator_delete__(local_190.data);
    }
    if (local_1a0.data != (double *)0x0) {
      operator_delete__(local_1a0.data);
    }
    if (local_1e8.data != (double *)0x0) {
      operator_delete__(local_1e8.data);
    }
    if (local_160.data != (double *)0x0) {
      operator_delete__(local_160.data);
    }
    iVar13 = 5;
  }
  return iVar13;
}

Assistant:

int SPP::solveSPV(Satellite* &&GPSPosAndVel, Satellite* &&BDSPosAndVel,
             Obs* &&GPSObs, Obs* &&BDSObs, Ephemeris* &&GPSEph,
             Ephemeris* &&BDSEph, ELLIPSOID type)
{
    int GPSObsNum = 0, BDSObsNum = 0;
    int cols = 4;
    for(int i = 0; i < MAXGPSSRN; ++i)
        if(GPSPosAndVel[i].n != -1 && GPSObs[i].dopp[0] != -1)
            GPSObsNum ++;
    for(int i = 0; i < MAXBDSSRN; ++i)
        if(BDSPosAndVel[i].n != -1 && BDSObs[i].dopp[0] != -1)
            BDSObsNum ++;
    // BDSObsNum = 0;
    XYZ RefPos = this->result.UserPositionXYZ;
    if(RefPos.Z == -1)
        return 1;
    // n * m
    MatrixXd B(BDSObsNum + GPSObsNum, cols);
    // n * n
    MatrixXd P(B.row(), B.row());
    // n * 1
    MatrixXd w(B.row(), 1);
    XYZ RefV(0, 0, 0);
    B.Zero();
    P.Zero();
    int count = 0;
    // cout << GPSObsNum << endl;
    double R = 0;
    int num = 0;
    for(int prn = 0; prn < MAXGPSSRN; ++prn)
    {
        if(GPSObsNum == 0)
            break;
        if(GPSPosAndVel[prn].n == -1 ||
            GPSObs[prn].dopp[0] == -1)
            continue;

        XYZ fix = GPSPosAndVel[prn].SatVelocity;
        // 在SPP时已经自转改正  故不需要再次改正
        XYZ SatPosi = this->result.GPSPosi[prn];
        XYZ pos = this->result.UserPositionXYZ;
        double rou = dist(SatPosi, pos);
        // double rou = this->result.GPSDist[prn];
        double l = (-SatPosi.X + RefPos.X) / rou; 
        double m = (-SatPosi.Y + RefPos.Y) / rou;
        double n = (-SatPosi.Z + RefPos.Z) / rou;

        double deltatdot = GPSPosAndVel[prn].clkdot;//GPSEph[prn].af1 + 2 * GPSEph[prn].af2 *
                            //(GPSPosAndVel[prn].t - GPSPosAndVel[prn].deltat - GPSEph[prn].toc);

        double roudot = -l * (fix.X) - m * (fix.Y) - n * (fix.Z);

        B(num, 0) = l;
        B(num, 1) = m;
        B(num, 2) = n;
        B(num, 3) = 1;
        w(num, 0) = -GPSObs[prn].dopp[0] * LIGHTSPEED / GPSL1 -
                    roudot + deltatdot * LIGHTSPEED - R;
        P(num, num) = 1;
        num ++;
    }
    for(int prn = 0; prn < MAXBDSSRN; ++prn)
    {
        if(BDSObsNum == 0)
            break;
        if(BDSPosAndVel[prn].n == -1 ||
            BDSObs[prn].dopp[0] == -1)
            continue;
        // 地球自转改正
        XYZ fix = BDSPosAndVel[prn].SatVelocity;
        // EarthRotationFix(BDSPosAndVel[prn].deltat, BDSPosAndVel[prn].SatVelocity, BDS, fix);
        // 在SPP时已经自转改正  故不需要再次改正
        XYZ SatPosi = this->result.BDSPosi[prn];
        XYZ pos = this->result.UserPositionXYZ;
        double rou = dist(SatPosi, pos);
        // double rou = this->result.BDSDist[prn];
        double l = (-SatPosi.X + RefPos.X) / rou; 
        double m = (-SatPosi.Y + RefPos.Y) / rou;
        double n = (-SatPosi.Z + RefPos.Z) / rou;

        double deltatdot = BDSPosAndVel[prn].clkdot;//BDSEph[prn].af1 + 2 * BDSEph[prn].af2 *
                            //(BDSPosAndVel[prn].t - BDSPosAndVel[prn].deltat - BDSEph[prn].toc);

        double roudot = -l * (fix.X) - m * (fix.Y) - n * (fix.Z);

        B(num, 0) = l;
        B(num, 1) = m;
        B(num, 2) = n;
        B(num, 3) = 1;
        w(num, 0) = -BDSObs[prn].dopp[0] * LIGHTSPEED / BDSB1 -
                    roudot + deltatdot * LIGHTSPEED - R;
        P(num, num) = 1;
        num ++;
    }
    int flag = 0;
    MatrixXd B_T = B.transpose();
    MatrixXd tmp1 = B_T * P;
    MatrixXd tmp2 = tmp1 * B;
    MatrixXd tmp3 = tmp2.inverse(flag);
    MatrixXd tmp4 = tmp3 * B_T;
    MatrixXd tmp5 = tmp4 * P;
    MatrixXd v = tmp5 * w;

    if(flag != 0){
        B_T.deleteMatrix();
        tmp1.deleteMatrix();
        tmp2.deleteMatrix();
        tmp3.deleteMatrix();
        tmp4.deleteMatrix();
        tmp5.deleteMatrix();
        P.deleteMatrix();
        w.deleteMatrix();
        B.deleteMatrix();
        v.deleteMatrix();
        return NOT_INVERTIBLE;
    }
    
    RefV.X += v(0, 0);
    RefV.Y += v(1, 0);
    RefV.Z += v(2, 0);
    R += v(3, 0);
    
    MatrixXd tmp6 = B * v;
    MatrixXd tmp7 = tmp6 - w;
    MatrixXd tmp8 = tmp7.transpose();
    MatrixXd tmp9 = tmp8 * P;
    MatrixXd tmp10 = tmp9 * tmp7;
    int Obsnum = 4;
    double sigma = sqrt(tmp10(0, 0) / (BDSObsNum + GPSObsNum - Obsnum));
    result.UserVelocitySigma = sigma;

    tmp6.deleteMatrix();
    tmp7.deleteMatrix();
    tmp8.deleteMatrix();
    tmp9.deleteMatrix();
    tmp10.deleteMatrix();

    Vector3d dx;
    for(int i = 0; i < dx.row(); i++)
        dx(i, 0) = v(i, 0);
    dx.deleteMatrix();
    B_T.deleteMatrix();
    tmp1.deleteMatrix();
    tmp2.deleteMatrix();
    tmp3.deleteMatrix();
    tmp4.deleteMatrix();
    tmp5.deleteMatrix();
    v.deleteMatrix();
    this->result.UserVelocity = RefV;
    B.deleteMatrix();
    P.deleteMatrix();
    w.deleteMatrix();
}